

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPHelperTests.cpp
# Opt level: O0

void __thiscall
OpenMPHelperTest_Locks_Test::~OpenMPHelperTest_Locks_Test(OpenMPHelperTest_Locks_Test *this)

{
  void *in_RDI;
  
  ~OpenMPHelperTest_Locks_Test((OpenMPHelperTest_Locks_Test *)0x2287c8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(OpenMPHelperTest, Locks) {
    // test that lock functions do not crash
    omp_lock_t lock;
    omp_init_lock(&lock);
    omp_set_lock(&lock);
    omp_unset_lock(&lock);
    omp_destroy_lock(&lock);
}